

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_CheckRST(Expression *expr,Expression *src)

{
  bool bVar1;
  uint8_t *puVar2;
  Expression *src_local;
  Expression *expr_local;
  
  memcpy(expr,src,0x30);
  bVar1 = rpn_isKnown(expr);
  if (bVar1) {
    if ((expr->val & 0xffffffc7U) != 0) {
      error("Invalid address $%x for RST\n",(ulong)(uint)expr->val);
    }
    expr->val = expr->val | 199;
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 1;
    puVar2 = reserveSpace(expr,1);
    *puVar2 = 'a';
  }
  return;
}

Assistant:

void rpn_CheckRST(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;

	if (rpn_isKnown(expr)) {
		// A valid RST address must be masked with 0x38
		if (expr->val & ~0x38)
			error("Invalid address $%" PRIx32 " for RST\n", expr->val);
		// The target is in the "0x38" bits, all other bits are set
		expr->val |= 0xC7;
	} else {
		expr->rpnPatchSize++;
		*reserveSpace(expr, 1) = RPN_RST;
	}
}